

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O3

void __thiscall App::drawScores(App *this,Graphics *g)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  size_type *psVar8;
  ulong uVar9;
  uint uVar10;
  stringstream ss;
  undefined1 auStack_228 [8];
  Ball *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  piksel::Graphics::push(g);
  piksel::Sprite::draw
            ((this->spritesheet).sprites.
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x27,g,0.0,0.0,32.0,32.0,false,false,false);
  piksel::Sprite::draw
            ((this->spritesheet).sprites.
             super__Vector_base<piksel::Sprite,_std::allocator<piksel::Sprite>_>._M_impl.
             super__Vector_impl_data._M_start + 0x28,g,(float)((this->super_BaseApp).width + -0x50),
             0.0,32.0,32.0,false,false,false);
  piksel::Graphics::textSize(g,16.0);
  uVar4 = Character::getLives(&this->character);
  uVar2 = -uVar4;
  if (0 < (int)uVar4) {
    uVar2 = uVar4;
  }
  uVar10 = 1;
  if (9 < uVar2) {
    uVar9 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar10 = uVar3;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0012b7ba;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0012b7ba;
      }
      if (uVar7 < 10000) goto LAB_0012b7ba;
      uVar9 = uVar9 / 10000;
      uVar3 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0012b7ba:
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct((ulong)local_1b8,(char)uVar10 - (char)((int)uVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_1b8[0]),uVar10,uVar2);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,0x1722cb);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1f8.field_2._M_allocated_capacity = *psVar8;
    local_1f8.field_2._8_8_ = plVar6[3];
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *psVar8;
    local_1f8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1f8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  piksel::Graphics::text(g,&local_1f8,32.0,24.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  local_220 = &this->ball;
  uVar4 = Ball::getLives(local_220);
  uVar2 = -uVar4;
  if (0 < (int)uVar4) {
    uVar2 = uVar4;
  }
  uVar10 = 1;
  if (9 < uVar2) {
    uVar9 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar10 = uVar3;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0012b901;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0012b901;
      }
      if (uVar7 < 10000) goto LAB_0012b901;
      uVar9 = uVar9 / 10000;
      uVar3 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0012b901:
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct((ulong)local_1b8,(char)uVar10 - (char)((int)uVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_1b8[0]),uVar10,uVar2);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,0x1722cb);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_218.field_2._M_allocated_capacity = *psVar8;
    local_218.field_2._8_8_ = plVar6[3];
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar8;
    local_218._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_218._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  piksel::Graphics::text(g,&local_218,(float)((this->super_BaseApp).width + -0x2f),24.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  lVar1 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar1 + 1] == '\0') {
    std::ios::widen((char)auStack_228 + (char)lVar1 + -0x80);
    acStack_c8[lVar1 + 1] = '\x01';
  }
  acStack_c8[lVar1] = '0';
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 6;
  iVar5 = Ball::getScore(local_220);
  std::ostream::operator<<((ostream *)local_1a8,iVar5);
  std::__cxx11::stringbuf::str();
  piksel::Graphics::text(g,&local_1d8,(float)((this->super_BaseApp).width / 2 + -0x27),24.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  piksel::Graphics::pop(g);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void App::drawScores(piksel::Graphics& g) {
    g.push();
    spritesheet.sprites[39].draw(g, 0, 0, 32, 32);
    spritesheet.sprites[40].draw(g, width - 80, 0, 32, 32);
    g.textSize(16);
    g.text("x0" + std::to_string(character.getLives()), 32, 24);
    g.text("x0" + std::to_string(ball.getLives()), width - 47, 24);
    std::stringstream ss;
    ss << std::setfill('0') << std::setw(6) << ball.getScore();
    g.text(ss.str(), width / 2 - 39, 24);
    g.pop();
}